

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgUtils.cpp
# Opt level: O0

int rsg::getTypeConstructorDepth(VariableType *type)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_> *this;
  pointer this_00;
  VariableType *this_01;
  int local_44;
  int depth;
  VariableType *memberType;
  __normal_iterator<const_rsg::VariableType::Member_*,_std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>_>
  local_30;
  const_iterator i;
  int maxDepth;
  vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_> *members;
  VariableType *type_local;
  
  TVar2 = VariableType::getBaseType(type);
  if (TVar2 - TYPE_FLOAT < 3) {
    type_local._4_4_ = 2;
  }
  else if (TVar2 == TYPE_STRUCT) {
    this = VariableType::getMembers(type);
    i._M_current._4_4_ = 0;
    local_30._M_current =
         (Member *)
         std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>::begin
                   (this);
    while( true ) {
      memberType = (VariableType *)
                   std::
                   vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>::
                   end(this);
      bVar1 = __gnu_cxx::operator!=
                        (&local_30,
                         (__normal_iterator<const_rsg::VariableType::Member_*,_std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>_>
                          *)&memberType);
      if (!bVar1) break;
      this_00 = __gnu_cxx::
                __normal_iterator<const_rsg::VariableType::Member_*,_std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>_>
                ::operator->(&local_30);
      this_01 = VariableType::Member::getType(this_00);
      local_44 = 0;
      TVar2 = VariableType::getBaseType(this_01);
      if (TVar2 - TYPE_FLOAT < 3) {
        iVar3 = VariableType::getNumElements(this_01);
        local_44 = 2;
        if (iVar3 == 1) {
          local_44 = 1;
        }
      }
      else if (TVar2 == TYPE_STRUCT) {
        local_44 = getTypeConstructorDepth(this_01);
      }
      i._M_current._4_4_ = de::max<int>(i._M_current._4_4_,local_44);
      __gnu_cxx::
      __normal_iterator<const_rsg::VariableType::Member_*,_std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>_>
      ::operator++(&local_30,0);
    }
    type_local._4_4_ = i._M_current._4_4_ + 1;
  }
  else {
    type_local._4_4_ = 0;
  }
  return type_local._4_4_;
}

Assistant:

int getTypeConstructorDepth (const VariableType& type)
{
	switch (type.getBaseType())
	{
		case VariableType::TYPE_STRUCT:
		{
			const vector<VariableType::Member>& members		= type.getMembers();
			int									maxDepth	= 0;
			for (vector<VariableType::Member>::const_iterator i = members.begin(); i != members.end(); i++)
			{
				const VariableType&	memberType	= i->getType();
				int					depth		= 0;
				switch (memberType.getBaseType())
				{
					case VariableType::TYPE_STRUCT:
						depth = getTypeConstructorDepth(memberType);
						break;

					case VariableType::TYPE_BOOL:
					case VariableType::TYPE_FLOAT:
					case VariableType::TYPE_INT:
						depth = memberType.getNumElements() == 1 ? 1 : 2;
						break;

					default:
						DE_ASSERT(DE_FALSE);
						break;
				}

				maxDepth = de::max(maxDepth, depth);
			}
			return maxDepth + 1;
		}

		case VariableType::TYPE_BOOL:
		case VariableType::TYPE_FLOAT:
		case VariableType::TYPE_INT:
			return 2; // One node for ctor, another for value

		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}